

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void output(gif_dest_ptr dinfo,code_int code)

{
  int iVar1;
  short in_SI;
  long in_RDI;
  
  *(uint *)(in_RDI + 0x4c) =
       *(uint *)(in_RDI + 0x4c) |
       (uint)((long)in_SI << ((byte)*(undefined4 *)(in_RDI + 0x50) & 0x3f));
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x40) + *(int *)(in_RDI + 0x50);
  while (7 < *(int *)(in_RDI + 0x50)) {
    iVar1 = *(int *)(in_RDI + 0x78) + 1;
    *(int *)(in_RDI + 0x78) = iVar1;
    *(char *)(in_RDI + 0x7c + (long)iVar1) = (char)*(undefined4 *)(in_RDI + 0x4c);
    if (0xfe < *(int *)(in_RDI + 0x78)) {
      flush_packet((gif_dest_ptr)0x109592);
    }
    *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) >> 8;
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + -8;
  }
  if (*(short *)(in_RDI + 0x44) < *(short *)(in_RDI + 0x60)) {
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
    if (*(int *)(in_RDI + 0x40) == 0xc) {
      *(undefined2 *)(in_RDI + 0x44) = 0x1000;
    }
    else {
      *(short *)(in_RDI + 0x44) = (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0x40) & 0x1f)) + -1;
    }
  }
  return;
}

Assistant:

LOCAL(void)
output(gif_dest_ptr dinfo, code_int code)
/* Emit a code of n_bits bits */
/* Uses cur_accum and cur_bits to reblock into 8-bit bytes */
{
  dinfo->cur_accum |= ((long)code) << dinfo->cur_bits;
  dinfo->cur_bits += dinfo->n_bits;

  while (dinfo->cur_bits >= 8) {
    CHAR_OUT(dinfo, dinfo->cur_accum & 0xFF);
    dinfo->cur_accum >>= 8;
    dinfo->cur_bits -= 8;
  }

  /*
   * If the next entry is going to be too big for the code size,
   * then increase it, if possible.  We do this here to ensure
   * that it's done in sync with the decoder's codesize increases.
   */
  if (dinfo->free_code > dinfo->maxcode) {
    dinfo->n_bits++;
    if (dinfo->n_bits == MAX_LZW_BITS)
      dinfo->maxcode = LZW_TABLE_SIZE; /* free_code will never exceed this */
    else
      dinfo->maxcode = MAXCODE(dinfo->n_bits);
  }
}